

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

SQOpcode __thiscall SQCompiler::ChooseArithOpByToken(SQCompiler *this,SQInteger tok)

{
  if (tok < 0x121) {
    switch(tok) {
    case 0x25:
      return _OP_MOD;
    case 0x2a:
      return _OP_MUL;
    case 0x2b:
      return _OP_ADD;
    case 0x2d:
      return _OP_SUB;
    case 0x2f:
      return _OP_DIV;
    }
  }
  else if (tok < 0x13d) {
    if (tok == 0x121) {
      return _OP_ADD;
    }
    if (tok == 0x122) {
      return _OP_SUB;
    }
  }
  else {
    if (tok == 0x13d) {
      return _OP_MUL;
    }
    if (tok == 0x13e) {
      return _OP_DIV;
    }
    if (tok == 0x13f) {
      return _OP_MOD;
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqcompiler.cpp"
                ,0x240,"SQOpcode SQCompiler::ChooseArithOpByToken(SQInteger)");
}

Assistant:

SQOpcode ChooseArithOpByToken(SQInteger tok)
    {
        switch(tok) {
            case TK_PLUSEQ: case '+': return _OP_ADD;
            case TK_MINUSEQ: case '-': return _OP_SUB;
            case TK_MULEQ: case '*': return _OP_MUL;
            case TK_DIVEQ: case '/': return _OP_DIV;
            case TK_MODEQ: case '%': return _OP_MOD;
            default: assert(0);
        }
        return _OP_ADD;
    }